

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_log_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2f::BuildLogTestDuplicateVersionHeader::Run
          (BuildLogTestDuplicateVersionHeader *this)

{
  int iVar1;
  Test *pTVar2;
  bool bVar3;
  LoadStatus LVar4;
  FILE *__s;
  LogEntry *pLVar5;
  int fail_count;
  int iVar6;
  allocator<char> local_d1;
  string local_d0;
  string err;
  BuildLog log;
  
  __s = fopen("BuildLogTest-tempfile","wb");
  fwrite("# ninja log v4\n",0xf,1,__s);
  fwrite("123\t456\t456\tout\tcommand\n",0x18,1,__s);
  fwrite("# ninja log v4\n",0xf,1,__s);
  fwrite("456\t789\t789\tout2\tcommand2\n",0x1a,1,__s);
  fclose(__s);
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  err.field_2._M_local_buf[0] = '\0';
  BuildLog::BuildLog(&log);
  pTVar2 = g_current_test;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"BuildLogTest-tempfile",&local_d1);
  LVar4 = BuildLog::Load(&log,&local_d0,&err);
  testing::Test::Check
            (pTVar2,LVar4 != LOAD_ERROR,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
             ,0xcc,"log.Load(kTestFilename, &err)");
  std::__cxx11::string::~string((string *)&local_d0);
  pTVar2 = g_current_test;
  bVar3 = std::operator==("",&err);
  bVar3 = testing::Test::Check
                    (pTVar2,bVar3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                     ,0xcd,"\"\" == err");
  if (bVar3) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"out",&local_d1);
    pLVar5 = BuildLog::LookupByOutput(&log,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    bVar3 = testing::Test::Check
                      (g_current_test,pLVar5 != (LogEntry *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                       ,0xd0,"e");
    if (((!bVar3) ||
        (bVar3 = testing::Test::Check
                           (g_current_test,pLVar5->start_time == 0x7b,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                            ,0xd1,"123 == e->start_time"), !bVar3)) ||
       (bVar3 = testing::Test::Check
                          (g_current_test,pLVar5->end_time == 0x1c8,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                           ,0xd2,"456 == e->end_time"), !bVar3)) goto LAB_0011c622;
    bVar3 = testing::Test::Check
                      (g_current_test,pLVar5->mtime == 0x1c8,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                       ,0xd3,"456 == e->mtime");
    iVar1 = g_current_test->assertion_failures_;
    iVar6 = iVar1;
    if (bVar3) {
      AssertHash("command",pLVar5->command_hash);
      iVar6 = g_current_test->assertion_failures_;
      if (iVar1 == iVar6) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"out2",&local_d1);
        pLVar5 = BuildLog::LookupByOutput(&log,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        bVar3 = testing::Test::Check
                          (g_current_test,pLVar5 != (LogEntry *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                           ,0xd7,"e");
        if (((!bVar3) ||
            (bVar3 = testing::Test::Check
                               (g_current_test,pLVar5->start_time == 0x1c8,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                                ,0xd8,"456 == e->start_time"), !bVar3)) ||
           (bVar3 = testing::Test::Check
                              (g_current_test,pLVar5->end_time == 0x315,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                               ,0xd9,"789 == e->end_time"), !bVar3)) goto LAB_0011c622;
        bVar3 = testing::Test::Check
                          (g_current_test,pLVar5->mtime == 0x315,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                           ,0xda,"789 == e->mtime");
        iVar1 = g_current_test->assertion_failures_;
        iVar6 = iVar1;
        if (bVar3) {
          AssertHash("command2",pLVar5->command_hash);
          iVar6 = g_current_test->assertion_failures_;
          if (iVar1 == iVar6) goto LAB_0011c62d;
        }
      }
    }
  }
  else {
LAB_0011c622:
    iVar6 = g_current_test->assertion_failures_;
  }
  g_current_test->assertion_failures_ = iVar6 + 1;
LAB_0011c62d:
  BuildLog::~BuildLog(&log);
  std::__cxx11::string::~string((string *)&err);
  return;
}

Assistant:

TEST_F(BuildLogTest, DuplicateVersionHeader) {
  // Old versions of ninja accidentally wrote multiple version headers to the
  // build log on Windows. This shouldn't crash, and the second version header
  // should be ignored.
  FILE* f = fopen(kTestFilename, "wb");
  fprintf(f, "# ninja log v4\n");
  fprintf(f, "123\t456\t456\tout\tcommand\n");
  fprintf(f, "# ninja log v4\n");
  fprintf(f, "456\t789\t789\tout2\tcommand2\n");
  fclose(f);

  string err;
  BuildLog log;
  EXPECT_TRUE(log.Load(kTestFilename, &err));
  ASSERT_EQ("", err);

  BuildLog::LogEntry* e = log.LookupByOutput("out");
  ASSERT_TRUE(e);
  ASSERT_EQ(123, e->start_time);
  ASSERT_EQ(456, e->end_time);
  ASSERT_EQ(456, e->mtime);
  ASSERT_NO_FATAL_FAILURE(AssertHash("command", e->command_hash));

  e = log.LookupByOutput("out2");
  ASSERT_TRUE(e);
  ASSERT_EQ(456, e->start_time);
  ASSERT_EQ(789, e->end_time);
  ASSERT_EQ(789, e->mtime);
  ASSERT_NO_FATAL_FAILURE(AssertHash("command2", e->command_hash));
}